

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86.cpp
# Opt level: O2

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Mat *weight_hr,Mat *hidden_state,Mat *cell_state,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint _h;
  void *pvVar9;
  size_t sVar10;
  int *piVar11;
  void *pvVar12;
  int qq;
  uint uVar13;
  void *pvVar14;
  void *pvVar15;
  uint uVar16;
  uint uVar17;
  void *pvVar18;
  ulong uVar19;
  long lVar20;
  float *pfVar21;
  ulong uVar22;
  float *pfVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  float H;
  float fVar29;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  Mat local_128;
  undefined1 local_d8 [16];
  ulong local_c0;
  long local_b8;
  ulong local_b0;
  Mat *local_a8;
  Mat *local_a0;
  ulong local_98;
  ulong local_90;
  long local_88;
  ulong local_80;
  Mat local_78;
  
  iVar6 = bottom_blob->w;
  uVar7 = bottom_blob->h;
  uVar8 = top_blob->w;
  _h = cell_state->w;
  local_128.cstep = 0;
  local_128.data = (void *)0x0;
  local_128.refcount._0_4_ = 0;
  local_128.refcount._4_4_ = 0;
  local_128.elemsize._0_4_ = 0;
  local_128.elemsize._4_4_ = 0;
  local_128.elempack = 0;
  local_128.allocator = (Allocator *)0x0;
  local_128.dims = 0;
  local_128.w = 0;
  local_128.h = 0;
  local_128.d = 0;
  local_128.c = 0;
  local_a0 = top_blob;
  Mat::create(&local_128,4,_h,4,opt->workspace_allocator);
  iVar24 = -100;
  if ((local_128.data == (void *)0x0) || ((long)local_128.c * local_128.cstep == 0))
  goto LAB_0033a044;
  local_78.cstep = 0;
  uVar26 = (ulong)(int)_h;
  local_78.data._0_4_ = 0;
  local_78.data._4_4_ = 0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator._0_4_ = 0;
  local_78.allocator._4_4_ = 0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  if (uVar8 == _h) {
LAB_00339553:
    local_b0 = uVar26 & 0xfffffffffffffffe;
    local_c0 = uVar26 & 0xfffffffffffffffc;
    uVar16 = (int)_h >> 1;
    if ((int)_h >> 1 < 1) {
      uVar16 = 0;
    }
    local_80 = (ulong)uVar16;
    uVar19 = (ulong)(uint)((int)_h >> 2);
    if ((int)_h >> 2 < 1) {
      uVar19 = 0;
    }
    uVar28 = 0;
    if (0 < (int)_h) {
      uVar28 = (ulong)_h;
    }
    local_98 = 0;
    if (0 < (int)uVar8) {
      local_98 = (ulong)uVar8;
    }
    uVar16 = 0;
    if (0 < (int)uVar7) {
      uVar16 = uVar7;
    }
    local_b8 = uVar19 << 2;
    local_a8 = weight_hc;
    local_90 = uVar28;
    for (uVar17 = 0; uVar17 != uVar16; uVar17 = uVar17 + 1) {
      uVar13 = ~uVar17 + uVar7;
      if (reverse == 0) {
        uVar13 = uVar17;
      }
      lVar20 = (long)(int)uVar13;
      for (uVar19 = 0; uVar22 = local_b0, uVar19 != local_80; uVar19 = uVar19 + 1) {
        pfVar21 = (float *)((long)weight_xc->w * uVar19 * weight_xc->elemsize +
                           (long)weight_xc->data);
        pfVar23 = (float *)((long)bias_c->data + uVar19 * 0x20);
        fVar29 = *pfVar23;
        fVar32 = pfVar23[1];
        fVar33 = pfVar23[2];
        fVar34 = pfVar23[3];
        fVar35 = pfVar23[4];
        fVar36 = pfVar23[5];
        fVar37 = pfVar23[6];
        fVar38 = pfVar23[7];
        pfVar23 = (float *)(bottom_blob->w * lVar20 * bottom_blob->elemsize +
                           (long)bottom_blob->data);
        fVar49 = 0.0;
        fVar50 = 0.0;
        fVar39 = 0.0;
        fVar48 = 0.0;
        fVar51 = 0.0;
        fVar52 = 0.0;
        fVar53 = 0.0;
        fVar54 = 0.0;
        auVar61 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar69 = ZEXT1664(ZEXT816(0) << 0x40);
        for (iVar24 = 0; iVar24 + 3 < iVar6; iVar24 = iVar24 + 4) {
          fVar2 = *pfVar23;
          fVar3 = pfVar23[1];
          fVar4 = pfVar23[2];
          fVar5 = pfVar23[3];
          fVar29 = fVar2 * *pfVar21 + fVar29;
          fVar32 = fVar2 * pfVar21[1] + fVar32;
          fVar33 = fVar2 * pfVar21[2] + fVar33;
          fVar34 = fVar2 * pfVar21[3] + fVar34;
          fVar35 = fVar2 * pfVar21[4] + fVar35;
          fVar36 = fVar2 * pfVar21[5] + fVar36;
          fVar37 = fVar2 * pfVar21[6] + fVar37;
          fVar38 = fVar2 + fVar38;
          auVar69 = ZEXT3264(CONCAT428(fVar2 + auVar69._28_4_,
                                       CONCAT424(fVar3 * pfVar21[0xe] + auVar69._24_4_,
                                                 CONCAT420(fVar3 * pfVar21[0xd] + auVar69._20_4_,
                                                           CONCAT416(fVar3 * pfVar21[0xc] +
                                                                     auVar69._16_4_,
                                                                     CONCAT412(fVar3 * pfVar21[0xb]
                                                                               + auVar69._12_4_,
                                                                               CONCAT48(fVar3 * 
                                                  pfVar21[10] + auVar69._8_4_,
                                                  CONCAT44(fVar3 * pfVar21[9] + auVar69._4_4_,
                                                           fVar3 * pfVar21[8] + auVar69._0_4_)))))))
                            );
          auVar61 = ZEXT3264(CONCAT428(fVar3 + auVar61._28_4_,
                                       CONCAT424(fVar4 * pfVar21[0x16] + auVar61._24_4_,
                                                 CONCAT420(fVar4 * pfVar21[0x15] + auVar61._20_4_,
                                                           CONCAT416(fVar4 * pfVar21[0x14] +
                                                                     auVar61._16_4_,
                                                                     CONCAT412(fVar4 * pfVar21[0x13]
                                                                               + auVar61._12_4_,
                                                                               CONCAT48(fVar4 * 
                                                  pfVar21[0x12] + auVar61._8_4_,
                                                  CONCAT44(fVar4 * pfVar21[0x11] + auVar61._4_4_,
                                                           fVar4 * pfVar21[0x10] + auVar61._0_4_))))
                                                  ))));
          fVar39 = fVar5 * pfVar21[0x18] + fVar39;
          fVar48 = fVar5 * pfVar21[0x19] + fVar48;
          fVar49 = fVar5 * pfVar21[0x1a] + fVar49;
          fVar50 = fVar5 * pfVar21[0x1b] + fVar50;
          fVar51 = fVar5 * pfVar21[0x1c] + fVar51;
          fVar52 = fVar5 * pfVar21[0x1d] + fVar52;
          fVar53 = fVar5 * pfVar21[0x1e] + fVar53;
          fVar54 = fVar2 + fVar54;
          pfVar23 = pfVar23 + 4;
          pfVar21 = pfVar21 + 0x20;
        }
        lVar27 = 0;
        for (; iVar24 < iVar6; iVar24 = iVar24 + 1) {
          fVar2 = *(float *)((long)pfVar23 + lVar27);
          pfVar1 = pfVar21 + lVar27 * 2;
          fVar29 = fVar2 * *pfVar1 + fVar29;
          fVar32 = fVar2 * pfVar1[1] + fVar32;
          fVar33 = fVar2 * pfVar1[2] + fVar33;
          fVar34 = fVar2 * pfVar1[3] + fVar34;
          fVar35 = fVar2 * pfVar1[4] + fVar35;
          fVar36 = fVar2 * pfVar1[5] + fVar36;
          fVar37 = fVar2 * pfVar1[6] + fVar37;
          fVar38 = fVar2 + fVar38;
          lVar27 = lVar27 + 4;
        }
        pfVar21 = (float *)((long)local_a8->data + (long)local_a8->w * uVar19 * local_a8->elemsize);
        pfVar23 = (float *)hidden_state->data;
        iVar24 = 0;
        while( true ) {
          if ((int)uVar8 <= iVar24 + 3) break;
          fVar2 = *pfVar23;
          fVar3 = pfVar23[1];
          fVar4 = pfVar23[2];
          fVar5 = pfVar23[3];
          fVar29 = fVar2 * *pfVar21 + fVar29;
          fVar32 = fVar2 * pfVar21[1] + fVar32;
          fVar33 = fVar2 * pfVar21[2] + fVar33;
          fVar34 = fVar2 * pfVar21[3] + fVar34;
          fVar35 = fVar2 * pfVar21[4] + fVar35;
          fVar36 = fVar2 * pfVar21[5] + fVar36;
          fVar37 = fVar2 * pfVar21[6] + fVar37;
          fVar38 = fVar2 + fVar38;
          auVar69 = ZEXT3264(CONCAT428(fVar2 + auVar69._28_4_,
                                       CONCAT424(fVar3 * pfVar21[0xe] + auVar69._24_4_,
                                                 CONCAT420(fVar3 * pfVar21[0xd] + auVar69._20_4_,
                                                           CONCAT416(fVar3 * pfVar21[0xc] +
                                                                     auVar69._16_4_,
                                                                     CONCAT412(fVar3 * pfVar21[0xb]
                                                                               + auVar69._12_4_,
                                                                               CONCAT48(fVar3 * 
                                                  pfVar21[10] + auVar69._8_4_,
                                                  CONCAT44(fVar3 * pfVar21[9] + auVar69._4_4_,
                                                           fVar3 * pfVar21[8] + auVar69._0_4_)))))))
                            );
          auVar61 = ZEXT3264(CONCAT428(fVar3 + auVar61._28_4_,
                                       CONCAT424(fVar4 * pfVar21[0x16] + auVar61._24_4_,
                                                 CONCAT420(fVar4 * pfVar21[0x15] + auVar61._20_4_,
                                                           CONCAT416(fVar4 * pfVar21[0x14] +
                                                                     auVar61._16_4_,
                                                                     CONCAT412(fVar4 * pfVar21[0x13]
                                                                               + auVar61._12_4_,
                                                                               CONCAT48(fVar4 * 
                                                  pfVar21[0x12] + auVar61._8_4_,
                                                  CONCAT44(fVar4 * pfVar21[0x11] + auVar61._4_4_,
                                                           fVar4 * pfVar21[0x10] + auVar61._0_4_))))
                                                  ))));
          fVar39 = fVar5 * pfVar21[0x18] + fVar39;
          fVar48 = fVar5 * pfVar21[0x19] + fVar48;
          fVar49 = fVar5 * pfVar21[0x1a] + fVar49;
          fVar50 = fVar5 * pfVar21[0x1b] + fVar50;
          fVar51 = fVar5 * pfVar21[0x1c] + fVar51;
          fVar52 = fVar5 * pfVar21[0x1d] + fVar52;
          fVar53 = fVar5 * pfVar21[0x1e] + fVar53;
          fVar54 = fVar2 + fVar54;
          pfVar23 = pfVar23 + 4;
          pfVar21 = pfVar21 + 0x20;
          iVar24 = iVar24 + 4;
        }
        lVar27 = 0;
        for (; iVar24 < (int)uVar8; iVar24 = iVar24 + 1) {
          fVar2 = *(float *)((long)pfVar23 + lVar27);
          pfVar1 = pfVar21 + lVar27 * 2;
          fVar29 = fVar2 * *pfVar1 + fVar29;
          fVar32 = fVar2 * pfVar1[1] + fVar32;
          fVar33 = fVar2 * pfVar1[2] + fVar33;
          fVar34 = fVar2 * pfVar1[3] + fVar34;
          fVar35 = fVar2 * pfVar1[4] + fVar35;
          fVar36 = fVar2 * pfVar1[5] + fVar36;
          fVar37 = fVar2 * pfVar1[6] + fVar37;
          fVar38 = fVar2 + fVar38;
          lVar27 = lVar27 + 4;
        }
        pfVar23 = (float *)((long)local_128.data +
                           uVar19 * 2 * (long)local_128.w *
                           CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize));
        *pfVar23 = auVar61._0_4_ + fVar39 + auVar69._0_4_ + fVar29;
        pfVar23[1] = auVar61._4_4_ + fVar48 + auVar69._4_4_ + fVar32;
        pfVar23[2] = auVar61._8_4_ + fVar49 + auVar69._8_4_ + fVar33;
        pfVar23[3] = auVar61._12_4_ + fVar50 + auVar69._12_4_ + fVar34;
        pfVar23[4] = auVar61._16_4_ + fVar51 + auVar69._16_4_ + fVar35;
        pfVar23[5] = auVar61._20_4_ + fVar52 + auVar69._20_4_ + fVar36;
        pfVar23[6] = auVar61._24_4_ + fVar53 + auVar69._24_4_ + fVar37;
        pfVar23[7] = auVar61._28_4_ + fVar54 + auVar69._28_4_ + fVar38;
      }
      for (; (long)uVar22 < (long)uVar26; uVar22 = uVar22 + 1) {
        uVar19 = (ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 | uVar22 & 0xffffffff;
        lVar27 = (long)((int)((long)uVar19 % 2) + (int)((long)uVar19 / 2));
        pfVar21 = (float *)(weight_xc->w * lVar27 * weight_xc->elemsize + (long)weight_xc->data);
        pfVar23 = (float *)((long)bias_c->data + uVar22 * 0x10);
        fVar29 = *pfVar23;
        fVar32 = pfVar23[1];
        fVar33 = pfVar23[2];
        fVar34 = pfVar23[3];
        pfVar23 = (float *)(bottom_blob->w * lVar20 * bottom_blob->elemsize +
                           (long)bottom_blob->data);
        fVar35 = 0.0;
        fVar36 = 0.0;
        fVar37 = 0.0;
        fVar38 = 0.0;
        auVar72 = ZEXT816(0) << 0x40;
        auVar63 = ZEXT816(0) << 0x40;
        for (iVar24 = 0; iVar24 + 3 < iVar6; iVar24 = iVar24 + 4) {
          fVar49 = *pfVar23;
          fVar50 = pfVar23[1];
          fVar39 = pfVar23[2];
          fVar48 = pfVar23[3];
          fVar29 = fVar49 * *pfVar21 + fVar29;
          fVar32 = fVar49 * pfVar21[1] + fVar32;
          fVar33 = fVar49 * pfVar21[2] + fVar33;
          fVar34 = fVar49 * pfVar21[3] + fVar34;
          fVar35 = fVar50 * pfVar21[4] + fVar35;
          fVar36 = fVar50 * pfVar21[5] + fVar36;
          fVar37 = fVar50 * pfVar21[6] + fVar37;
          fVar38 = fVar50 * pfVar21[7] + fVar38;
          auVar55._0_4_ = fVar39 * pfVar21[8] + auVar72._0_4_;
          auVar55._4_4_ = fVar39 * pfVar21[9] + auVar72._4_4_;
          auVar55._8_4_ = fVar39 * pfVar21[10] + auVar72._8_4_;
          auVar55._12_4_ = fVar39 * pfVar21[0xb] + auVar72._12_4_;
          auVar62._0_4_ = fVar48 * pfVar21[0xc] + auVar63._0_4_;
          auVar62._4_4_ = fVar48 * pfVar21[0xd] + auVar63._4_4_;
          auVar62._8_4_ = fVar48 * pfVar21[0xe] + auVar63._8_4_;
          auVar62._12_4_ = fVar48 * pfVar21[0xf] + auVar63._12_4_;
          pfVar23 = pfVar23 + 4;
          pfVar21 = pfVar21 + 0x10;
          auVar72 = auVar55;
          auVar63 = auVar62;
        }
        lVar25 = 0;
        for (; iVar24 < iVar6; iVar24 = iVar24 + 1) {
          fVar49 = *(float *)((long)pfVar23 + lVar25);
          pfVar1 = pfVar21 + lVar25;
          fVar29 = fVar49 * *pfVar1 + fVar29;
          fVar32 = fVar49 * pfVar1[1] + fVar32;
          fVar33 = fVar49 * pfVar1[2] + fVar33;
          fVar34 = fVar49 * pfVar1[3] + fVar34;
          lVar25 = lVar25 + 4;
        }
        pfVar21 = (float *)((long)local_a8->data + local_a8->w * lVar27 * local_a8->elemsize);
        pfVar23 = (float *)hidden_state->data;
        iVar24 = 0;
        while( true ) {
          fVar49 = auVar72._4_4_;
          fVar50 = auVar72._8_4_;
          fVar39 = auVar72._12_4_;
          fVar48 = auVar63._4_4_;
          fVar51 = auVar63._8_4_;
          fVar52 = auVar63._12_4_;
          if ((int)uVar8 <= iVar24 + 3) break;
          fVar53 = *pfVar23;
          fVar54 = pfVar23[1];
          fVar2 = pfVar23[2];
          fVar3 = pfVar23[3];
          fVar29 = fVar53 * *pfVar21 + fVar29;
          fVar32 = fVar53 * pfVar21[1] + fVar32;
          fVar33 = fVar53 * pfVar21[2] + fVar33;
          fVar34 = fVar53 * pfVar21[3] + fVar34;
          fVar35 = fVar54 * pfVar21[4] + fVar35;
          fVar36 = fVar54 * pfVar21[5] + fVar36;
          fVar37 = fVar54 * pfVar21[6] + fVar37;
          fVar38 = fVar54 * pfVar21[7] + fVar38;
          auVar72._0_4_ = fVar2 * pfVar21[8] + auVar72._0_4_;
          auVar72._4_4_ = fVar2 * pfVar21[9] + fVar49;
          auVar72._8_4_ = fVar2 * pfVar21[10] + fVar50;
          auVar72._12_4_ = fVar2 * pfVar21[0xb] + fVar39;
          auVar63._0_4_ = fVar3 * pfVar21[0xc] + auVar63._0_4_;
          auVar63._4_4_ = fVar3 * pfVar21[0xd] + fVar48;
          auVar63._8_4_ = fVar3 * pfVar21[0xe] + fVar51;
          auVar63._12_4_ = fVar3 * pfVar21[0xf] + fVar52;
          pfVar23 = pfVar23 + 4;
          pfVar21 = pfVar21 + 0x10;
          iVar24 = iVar24 + 4;
        }
        lVar27 = 0;
        for (; iVar24 < (int)uVar8; iVar24 = iVar24 + 1) {
          fVar53 = *(float *)((long)pfVar23 + lVar27);
          pfVar1 = pfVar21 + lVar27;
          fVar29 = fVar53 * *pfVar1 + fVar29;
          fVar32 = fVar53 * pfVar1[1] + fVar32;
          fVar33 = fVar53 * pfVar1[2] + fVar33;
          fVar34 = fVar53 * pfVar1[3] + fVar34;
          lVar27 = lVar27 + 4;
        }
        pfVar23 = (float *)((long)local_128.data +
                           (long)local_128.w * uVar22 *
                           CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize));
        *pfVar23 = auVar72._0_4_ + fVar35 + auVar63._0_4_ + fVar29;
        pfVar23[1] = fVar49 + fVar36 + fVar48 + fVar32;
        pfVar23[2] = fVar50 + fVar37 + fVar51 + fVar33;
        pfVar23[3] = fVar39 + fVar38 + fVar52 + fVar34;
      }
      pvVar18 = (void *)(local_a0->w * lVar20 * local_a0->elemsize + (long)local_a0->data);
      pvVar15 = cell_state->data;
      pvVar9 = hidden_state->data;
      pvVar12 = (void *)CONCAT44(local_78.data._4_4_,local_78.data._0_4_);
      for (lVar20 = 0; local_b8 != lVar20; lVar20 = lVar20 + 4) {
        lVar27 = local_128.w * lVar20 *
                 CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
        auVar72 = *(undefined1 (*) [16])((long)local_128.data + lVar27 + 0x10);
        auVar63 = *(undefined1 (*) [16])((long)local_128.data + lVar27 + 0x20);
        auVar55 = *(undefined1 (*) [16])((long)local_128.data + lVar27 + 0x30);
        auVar62 = vunpcklps_avx(*(undefined1 (*) [16])((long)local_128.data + lVar27),auVar72);
        auVar30 = vunpcklps_avx(auVar63,auVar55);
        auVar43 = vunpckhps_avx(*(undefined1 (*) [16])((long)local_128.data + lVar27),auVar72);
        auVar63 = vunpckhps_avx(auVar63,auVar55);
        auVar72 = vmovlhps_avx(auVar62,auVar30);
        local_d8 = vunpckhpd_avx(auVar62,auVar30);
        auVar62 = vmovlhps_avx(auVar43,auVar63);
        auVar43 = vunpckhpd_avx(auVar43,auVar63);
        auVar64._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
        auVar64._8_4_ = auVar72._8_4_ ^ 0x80000000;
        auVar64._12_4_ = auVar72._12_4_ ^ 0x80000000;
        auVar91._8_4_ = 0x42b0c0a5;
        auVar91._0_8_ = 0x42b0c0a542b0c0a5;
        auVar91._12_4_ = 0x42b0c0a5;
        auVar72 = vminps_avx(auVar91,auVar64);
        auVar92._8_4_ = 0xc2b0c0a5;
        auVar92._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar92._12_4_ = 0xc2b0c0a5;
        auVar55 = vmaxps_avx(auVar92,auVar72);
        auVar70._0_4_ = auVar55._0_4_ * 1.442695 + 0.5;
        auVar70._4_4_ = auVar55._4_4_ * 1.442695 + 0.5;
        auVar70._8_4_ = auVar55._8_4_ * 1.442695 + 0.5;
        auVar70._12_4_ = auVar55._12_4_ * 1.442695 + 0.5;
        auVar82._0_4_ = (int)auVar70._0_4_;
        auVar82._4_4_ = (int)auVar70._4_4_;
        auVar82._8_4_ = (int)auVar70._8_4_;
        auVar82._12_4_ = (int)auVar70._12_4_;
        auVar63 = vcvtdq2ps_avx(auVar82);
        auVar72 = vcmpps_avx(auVar70,auVar63,1);
        auVar93._8_4_ = 0x3f800000;
        auVar93._0_8_ = 0x3f8000003f800000;
        auVar93._12_4_ = 0x3f800000;
        auVar72 = vandps_avx(auVar93,auVar72);
        auVar72 = vsubps_avx(auVar63,auVar72);
        auVar83._0_4_ = auVar72._0_4_ * 0.6931472;
        auVar83._4_4_ = auVar72._4_4_ * 0.6931472;
        auVar83._8_4_ = auVar72._8_4_ * 0.6931472;
        auVar83._12_4_ = auVar72._12_4_ * 0.6931472;
        auVar63 = vsubps_avx(auVar55,auVar83);
        fVar29 = auVar63._0_4_;
        fVar32 = auVar63._4_4_;
        fVar33 = auVar63._8_4_;
        fVar34 = auVar63._12_4_;
        auVar71._0_4_ = (int)auVar72._0_4_;
        auVar71._4_4_ = (int)auVar72._4_4_;
        auVar71._8_4_ = (int)auVar72._8_4_;
        auVar71._12_4_ = (int)auVar72._12_4_;
        auVar72 = vpslld_avx(auVar71,0x17);
        auVar72 = vpaddd_avx(auVar93,auVar72);
        auVar65._0_4_ =
             (fVar29 + 1.0 +
             fVar29 * fVar29 *
             (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
               0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar72._0_4_ + 1.0;
        auVar65._4_4_ =
             (fVar32 + 1.0 +
             fVar32 * fVar32 *
             (((((fVar32 * 0.00019875691 + 0.0013981999) * fVar32 + 0.008333452) * fVar32 +
               0.041665796) * fVar32 + 0.16666666) * fVar32 + 0.5)) * auVar72._4_4_ + 1.0;
        auVar65._8_4_ =
             (fVar33 + 1.0 +
             fVar33 * fVar33 *
             (((((fVar33 * 0.00019875691 + 0.0013981999) * fVar33 + 0.008333452) * fVar33 +
               0.041665796) * fVar33 + 0.16666666) * fVar33 + 0.5)) * auVar72._8_4_ + 1.0;
        auVar65._12_4_ =
             (fVar34 + 1.0 +
             fVar34 * fVar34 *
             (((((fVar34 * 0.00019875691 + 0.0013981999) * fVar34 + 0.008333452) * fVar34 +
               0.041665796) * fVar34 + 0.16666666) * fVar34 + 0.5)) * auVar72._12_4_ + 1.0;
        auVar56._0_4_ = auVar43._0_4_ * -2.0;
        auVar56._4_4_ = auVar43._4_4_ * -2.0;
        auVar56._8_4_ = auVar43._8_4_ * -2.0;
        auVar56._12_4_ = auVar43._12_4_ * -2.0;
        auVar72 = vminps_avx(auVar91,auVar56);
        auVar55 = vmaxps_avx(auVar92,auVar72);
        auVar73._0_4_ = auVar55._0_4_ * 1.442695 + 0.5;
        auVar73._4_4_ = auVar55._4_4_ * 1.442695 + 0.5;
        auVar73._8_4_ = auVar55._8_4_ * 1.442695 + 0.5;
        auVar73._12_4_ = auVar55._12_4_ * 1.442695 + 0.5;
        auVar84._0_4_ = (int)auVar73._0_4_;
        auVar84._4_4_ = (int)auVar73._4_4_;
        auVar84._8_4_ = (int)auVar73._8_4_;
        auVar84._12_4_ = (int)auVar73._12_4_;
        auVar63 = vcvtdq2ps_avx(auVar84);
        auVar72 = vcmpps_avx(auVar73,auVar63,1);
        auVar72 = vandps_avx(auVar93,auVar72);
        auVar72 = vsubps_avx(auVar63,auVar72);
        auVar85._0_4_ = auVar72._0_4_ * 0.6931472;
        auVar85._4_4_ = auVar72._4_4_ * 0.6931472;
        auVar85._8_4_ = auVar72._8_4_ * 0.6931472;
        auVar85._12_4_ = auVar72._12_4_ * 0.6931472;
        auVar63 = vsubps_avx(auVar55,auVar85);
        fVar29 = auVar63._0_4_;
        fVar32 = auVar63._4_4_;
        fVar33 = auVar63._8_4_;
        fVar34 = auVar63._12_4_;
        auVar43 = vrcpps_avx(auVar65);
        auVar74._0_4_ = (int)auVar72._0_4_;
        auVar74._4_4_ = (int)auVar72._4_4_;
        auVar74._8_4_ = (int)auVar72._8_4_;
        auVar74._12_4_ = (int)auVar72._12_4_;
        auVar72 = vpslld_avx(auVar74,0x17);
        auVar72 = vpaddd_avx(auVar93,auVar72);
        auVar57._0_4_ =
             (fVar29 + 1.0 +
             fVar29 * fVar29 *
             (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
               0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar72._0_4_ + 1.0;
        auVar57._4_4_ =
             (fVar32 + 1.0 +
             fVar32 * fVar32 *
             (((((fVar32 * 0.00019875691 + 0.0013981999) * fVar32 + 0.008333452) * fVar32 +
               0.041665796) * fVar32 + 0.16666666) * fVar32 + 0.5)) * auVar72._4_4_ + 1.0;
        auVar57._8_4_ =
             (fVar33 + 1.0 +
             fVar33 * fVar33 *
             (((((fVar33 * 0.00019875691 + 0.0013981999) * fVar33 + 0.008333452) * fVar33 +
               0.041665796) * fVar33 + 0.16666666) * fVar33 + 0.5)) * auVar72._8_4_ + 1.0;
        auVar57._12_4_ =
             (fVar34 + 1.0 +
             fVar34 * fVar34 *
             (((((fVar34 * 0.00019875691 + 0.0013981999) * fVar34 + 0.008333452) * fVar34 +
               0.041665796) * fVar34 + 0.16666666) * fVar34 + 0.5)) * auVar72._12_4_ + 1.0;
        auVar72 = vrcpps_avx(auVar57);
        fVar29 = auVar72._0_4_;
        fVar32 = auVar72._4_4_;
        fVar33 = auVar72._8_4_;
        fVar34 = auVar72._12_4_;
        auVar58._0_4_ = auVar57._0_4_ * (fVar29 + fVar29);
        auVar58._4_4_ = auVar57._4_4_ * (fVar32 + fVar32);
        auVar58._8_4_ = auVar57._8_4_ * (fVar33 + fVar33);
        auVar58._12_4_ = auVar57._12_4_ * (fVar34 + fVar34);
        auVar30._8_4_ = 0x40000000;
        auVar30._0_8_ = 0x4000000040000000;
        auVar30._12_4_ = 0x40000000;
        auVar72 = vsubps_avx(auVar30,auVar58);
        auVar75._0_4_ = fVar29 + fVar29 + -1.0 + fVar29 * auVar72._0_4_;
        auVar75._4_4_ = fVar32 + fVar32 + -1.0 + fVar32 * auVar72._4_4_;
        auVar75._8_4_ = fVar33 + fVar33 + -1.0 + fVar33 * auVar72._8_4_;
        auVar75._12_4_ = fVar34 + fVar34 + -1.0 + fVar34 * auVar72._12_4_;
        fVar36 = auVar75._0_4_ * auVar43._0_4_;
        fVar38 = auVar75._4_4_ * auVar43._4_4_;
        fVar39 = auVar75._8_4_ * auVar43._8_4_;
        fVar48 = auVar75._12_4_ * auVar43._12_4_;
        auVar66._0_4_ = auVar65._0_4_ * fVar36;
        auVar66._4_4_ = auVar65._4_4_ * fVar38;
        auVar66._8_4_ = auVar65._8_4_ * fVar39;
        auVar66._12_4_ = auVar65._12_4_ * fVar48;
        auVar44 = vsubps_avx(auVar75,auVar66);
        auVar40._0_8_ = local_d8._0_8_ ^ 0x8000000080000000;
        auVar40._8_4_ = local_d8._8_4_ ^ 0x80000000;
        auVar40._12_4_ = local_d8._12_4_ ^ 0x80000000;
        auVar72 = vminps_avx(auVar91,auVar40);
        auVar55 = vmaxps_avx(auVar92,auVar72);
        auVar76._0_4_ = auVar55._0_4_ * 1.442695 + 0.5;
        auVar76._4_4_ = auVar55._4_4_ * 1.442695 + 0.5;
        auVar76._8_4_ = auVar55._8_4_ * 1.442695 + 0.5;
        auVar76._12_4_ = auVar55._12_4_ * 1.442695 + 0.5;
        auVar86._0_4_ = (int)auVar76._0_4_;
        auVar86._4_4_ = (int)auVar76._4_4_;
        auVar86._8_4_ = (int)auVar76._8_4_;
        auVar86._12_4_ = (int)auVar76._12_4_;
        auVar63 = vcvtdq2ps_avx(auVar86);
        auVar72 = vcmpps_avx(auVar76,auVar63,1);
        auVar72 = vandps_avx(auVar93,auVar72);
        auVar72 = vsubps_avx(auVar63,auVar72);
        auVar87._0_4_ = auVar72._0_4_ * 0.6931472;
        auVar87._4_4_ = auVar72._4_4_ * 0.6931472;
        auVar87._8_4_ = auVar72._8_4_ * 0.6931472;
        auVar87._12_4_ = auVar72._12_4_ * 0.6931472;
        auVar63 = vsubps_avx(auVar55,auVar87);
        fVar29 = auVar63._0_4_;
        fVar32 = auVar63._4_4_;
        fVar33 = auVar63._8_4_;
        fVar34 = auVar63._12_4_;
        auVar77._0_4_ = (int)auVar72._0_4_;
        auVar77._4_4_ = (int)auVar72._4_4_;
        auVar77._8_4_ = (int)auVar72._8_4_;
        auVar77._12_4_ = (int)auVar72._12_4_;
        auVar72 = vpslld_avx(auVar77,0x17);
        auVar72 = vpaddd_avx(auVar93,auVar72);
        auVar41._0_4_ =
             (fVar29 + 1.0 +
             fVar29 * fVar29 *
             (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
               0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar72._0_4_ + 1.0;
        auVar41._4_4_ =
             (fVar32 + 1.0 +
             fVar32 * fVar32 *
             (((((fVar32 * 0.00019875691 + 0.0013981999) * fVar32 + 0.008333452) * fVar32 +
               0.041665796) * fVar32 + 0.16666666) * fVar32 + 0.5)) * auVar72._4_4_ + 1.0;
        auVar41._8_4_ =
             (fVar33 + 1.0 +
             fVar33 * fVar33 *
             (((((fVar33 * 0.00019875691 + 0.0013981999) * fVar33 + 0.008333452) * fVar33 +
               0.041665796) * fVar33 + 0.16666666) * fVar33 + 0.5)) * auVar72._8_4_ + 1.0;
        auVar41._12_4_ =
             (fVar34 + 1.0 +
             fVar34 * fVar34 *
             (((((fVar34 * 0.00019875691 + 0.0013981999) * fVar34 + 0.008333452) * fVar34 +
               0.041665796) * fVar34 + 0.16666666) * fVar34 + 0.5)) * auVar72._12_4_ + 1.0;
        auVar30 = vrcpps_avx(auVar41);
        auVar72 = *(undefined1 (*) [16])((long)pvVar15 + lVar20 * 4);
        fVar32 = auVar72._0_4_ * auVar30._0_4_;
        fVar34 = auVar72._4_4_ * auVar30._4_4_;
        fVar51 = auVar72._8_4_ * auVar30._8_4_;
        fVar52 = auVar72._12_4_ * auVar30._12_4_;
        auVar42._0_4_ = auVar41._0_4_ * fVar32;
        auVar42._4_4_ = auVar41._4_4_ * fVar34;
        auVar42._8_4_ = auVar41._8_4_ * fVar51;
        auVar42._12_4_ = auVar41._12_4_ * fVar52;
        auVar40 = vsubps_avx(auVar72,auVar42);
        auVar31._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
        auVar31._8_4_ = auVar62._8_4_ ^ 0x80000000;
        auVar31._12_4_ = auVar62._12_4_ ^ 0x80000000;
        auVar72 = vminps_avx(auVar91,auVar31);
        auVar55 = vmaxps_avx(auVar92,auVar72);
        auVar78._0_4_ = auVar55._0_4_ * 1.442695 + 0.5;
        auVar78._4_4_ = auVar55._4_4_ * 1.442695 + 0.5;
        auVar78._8_4_ = auVar55._8_4_ * 1.442695 + 0.5;
        auVar78._12_4_ = auVar55._12_4_ * 1.442695 + 0.5;
        auVar88._0_4_ = (int)auVar78._0_4_;
        auVar88._4_4_ = (int)auVar78._4_4_;
        auVar88._8_4_ = (int)auVar78._8_4_;
        auVar88._12_4_ = (int)auVar78._12_4_;
        auVar63 = vcvtdq2ps_avx(auVar88);
        auVar72 = vcmpps_avx(auVar78,auVar63,1);
        auVar72 = vandps_avx(auVar93,auVar72);
        auVar72 = vsubps_avx(auVar63,auVar72);
        auVar89._0_4_ = auVar72._0_4_ * 0.6931472;
        auVar89._4_4_ = auVar72._4_4_ * 0.6931472;
        auVar89._8_4_ = auVar72._8_4_ * 0.6931472;
        auVar89._12_4_ = auVar72._12_4_ * 0.6931472;
        auVar63 = vsubps_avx(auVar55,auVar89);
        fVar29 = auVar63._0_4_;
        fVar33 = auVar63._4_4_;
        fVar35 = auVar63._8_4_;
        fVar37 = auVar63._12_4_;
        auVar79._0_4_ = (int)auVar72._0_4_;
        auVar79._4_4_ = (int)auVar72._4_4_;
        auVar79._8_4_ = (int)auVar72._8_4_;
        auVar79._12_4_ = (int)auVar72._12_4_;
        auVar72 = vpslld_avx(auVar79,0x17);
        auVar62 = vpaddd_avx(auVar93,auVar72);
        fVar49 = fVar32 + auVar30._0_4_ * auVar40._0_4_ + fVar36 + auVar43._0_4_ * auVar44._0_4_;
        fVar50 = fVar34 + auVar30._4_4_ * auVar40._4_4_ + fVar38 + auVar43._4_4_ * auVar44._4_4_;
        fVar39 = fVar51 + auVar30._8_4_ * auVar40._8_4_ + fVar39 + auVar43._8_4_ * auVar44._8_4_;
        fVar48 = fVar52 + auVar30._12_4_ * auVar40._12_4_ + fVar48 + auVar43._12_4_ * auVar44._12_4_
        ;
        auVar43._0_4_ = fVar49 * -2.0;
        auVar43._4_4_ = fVar50 * -2.0;
        auVar43._8_4_ = fVar39 * -2.0;
        auVar43._12_4_ = fVar48 * -2.0;
        auVar72 = vminps_avx(auVar91,auVar43);
        auVar55 = vmaxps_avx(auVar92,auVar72);
        auVar59._0_4_ = auVar55._0_4_ * 1.442695 + 0.5;
        auVar59._4_4_ = auVar55._4_4_ * 1.442695 + 0.5;
        auVar59._8_4_ = auVar55._8_4_ * 1.442695 + 0.5;
        auVar59._12_4_ = auVar55._12_4_ * 1.442695 + 0.5;
        auVar67._0_4_ = (int)auVar59._0_4_;
        auVar67._4_4_ = (int)auVar59._4_4_;
        auVar67._8_4_ = (int)auVar59._8_4_;
        auVar67._12_4_ = (int)auVar59._12_4_;
        auVar63 = vcvtdq2ps_avx(auVar67);
        auVar72 = vcmpps_avx(auVar59,auVar63,1);
        auVar72 = vandps_avx(auVar93,auVar72);
        auVar72 = vsubps_avx(auVar63,auVar72);
        auVar68._0_4_ = auVar72._0_4_ * 0.6931472;
        auVar68._4_4_ = auVar72._4_4_ * 0.6931472;
        auVar68._8_4_ = auVar72._8_4_ * 0.6931472;
        auVar68._12_4_ = auVar72._12_4_ * 0.6931472;
        auVar63 = vsubps_avx(auVar55,auVar68);
        fVar32 = auVar63._0_4_;
        fVar34 = auVar63._4_4_;
        fVar36 = auVar63._8_4_;
        fVar38 = auVar63._12_4_;
        auVar80._0_4_ =
             (fVar29 + 1.0 +
             fVar29 * fVar29 *
             (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
               0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar62._0_4_ + 1.0;
        auVar80._4_4_ =
             (fVar33 + 1.0 +
             fVar33 * fVar33 *
             (((((fVar33 * 0.00019875691 + 0.0013981999) * fVar33 + 0.008333452) * fVar33 +
               0.041665796) * fVar33 + 0.16666666) * fVar33 + 0.5)) * auVar62._4_4_ + 1.0;
        auVar80._8_4_ =
             (fVar35 + 1.0 +
             fVar35 * fVar35 *
             (((((fVar35 * 0.00019875691 + 0.0013981999) * fVar35 + 0.008333452) * fVar35 +
               0.041665796) * fVar35 + 0.16666666) * fVar35 + 0.5)) * auVar62._8_4_ + 1.0;
        auVar80._12_4_ =
             (fVar37 + 1.0 +
             fVar37 * fVar37 *
             (((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) * fVar37 +
               0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5)) * auVar62._12_4_ + 1.0;
        auVar60._0_4_ = (int)auVar72._0_4_;
        auVar60._4_4_ = (int)auVar72._4_4_;
        auVar60._8_4_ = (int)auVar72._8_4_;
        auVar60._12_4_ = (int)auVar72._12_4_;
        auVar72 = vpslld_avx(auVar60,0x17);
        auVar72 = vpaddd_avx(auVar93,auVar72);
        auVar44._0_4_ =
             (fVar32 + 1.0 +
             fVar32 * fVar32 *
             (((((fVar32 * 0.00019875691 + 0.0013981999) * fVar32 + 0.008333452) * fVar32 +
               0.041665796) * fVar32 + 0.16666666) * fVar32 + 0.5)) * auVar72._0_4_ + 1.0;
        auVar44._4_4_ =
             (fVar34 + 1.0 +
             fVar34 * fVar34 *
             (((((fVar34 * 0.00019875691 + 0.0013981999) * fVar34 + 0.008333452) * fVar34 +
               0.041665796) * fVar34 + 0.16666666) * fVar34 + 0.5)) * auVar72._4_4_ + 1.0;
        auVar44._8_4_ =
             (fVar36 + 1.0 +
             fVar36 * fVar36 *
             (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
               0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5)) * auVar72._8_4_ + 1.0;
        auVar44._12_4_ =
             (fVar38 + 1.0 +
             fVar38 * fVar38 *
             (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
               0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5)) * auVar72._12_4_ + 1.0;
        auVar72 = vrcpps_avx(auVar44);
        fVar29 = auVar72._0_4_;
        fVar32 = auVar72._4_4_;
        fVar33 = auVar72._8_4_;
        fVar34 = auVar72._12_4_;
        auVar45._0_4_ = auVar44._0_4_ * (fVar29 + fVar29);
        auVar45._4_4_ = auVar44._4_4_ * (fVar32 + fVar32);
        auVar45._8_4_ = auVar44._8_4_ * (fVar33 + fVar33);
        auVar45._12_4_ = auVar44._12_4_ * (fVar34 + fVar34);
        auVar90._8_4_ = 0x40000000;
        auVar90._0_8_ = 0x4000000040000000;
        auVar90._12_4_ = 0x40000000;
        auVar63 = vsubps_avx(auVar90,auVar45);
        auVar72 = vrcpps_avx(auVar80);
        auVar46._0_4_ = fVar29 + fVar29 + -1.0 + fVar29 * auVar63._0_4_;
        auVar46._4_4_ = fVar32 + fVar32 + -1.0 + fVar32 * auVar63._4_4_;
        auVar46._8_4_ = fVar33 + fVar33 + -1.0 + fVar33 * auVar63._8_4_;
        auVar46._12_4_ = fVar34 + fVar34 + -1.0 + fVar34 * auVar63._12_4_;
        fVar29 = auVar46._0_4_ * auVar72._0_4_;
        fVar32 = auVar46._4_4_ * auVar72._4_4_;
        fVar33 = auVar46._8_4_ * auVar72._8_4_;
        fVar34 = auVar46._12_4_ * auVar72._12_4_;
        auVar81._0_4_ = auVar80._0_4_ * fVar29;
        auVar81._4_4_ = auVar80._4_4_ * fVar32;
        auVar81._8_4_ = auVar80._8_4_ * fVar33;
        auVar81._12_4_ = auVar80._12_4_ * fVar34;
        auVar63 = vsubps_avx(auVar46,auVar81);
        auVar47._0_4_ = fVar29 + auVar72._0_4_ * auVar63._0_4_;
        auVar47._4_4_ = fVar32 + auVar72._4_4_ * auVar63._4_4_;
        auVar47._8_4_ = fVar33 + auVar72._8_4_ * auVar63._8_4_;
        auVar47._12_4_ = fVar34 + auVar72._12_4_ * auVar63._12_4_;
        pfVar23 = (float *)((long)pvVar15 + lVar20 * 4);
        *pfVar23 = fVar49;
        pfVar23[1] = fVar50;
        pfVar23[2] = fVar39;
        pfVar23[3] = fVar48;
        pvVar14 = pvVar12;
        if (uVar8 == _h) {
          *(undefined1 (*) [16])((long)pvVar9 + lVar20 * 4) = auVar47;
          pvVar14 = pvVar18;
        }
        *(undefined1 (*) [16])((long)pvVar14 + lVar20 * 4) = auVar47;
      }
      local_88 = (long)local_128.w *
                 CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
      pfVar23 = (float *)((long)local_128.data + local_88 * local_c0 + 0xc);
      for (uVar19 = local_c0; (long)uVar19 < (long)uVar26; uVar19 = uVar19 + 1) {
        fVar29 = *pfVar23;
        fVar32 = pfVar23[-2];
        fVar33 = pfVar23[-1];
        fVar34 = expf(-pfVar23[-3]);
        local_d8._0_4_ = fVar34 + 1.0;
        fVar32 = expf(-fVar32);
        fVar33 = expf(-fVar33);
        fVar29 = tanhf(fVar29);
        fVar29 = *(float *)((long)pvVar15 + uVar19 * 4) / (fVar32 + 1.0) +
                 fVar29 / (float)local_d8._0_4_;
        fVar32 = tanhf(fVar29);
        fVar32 = fVar32 / (fVar33 + 1.0);
        *(float *)((long)pvVar15 + uVar19 * 4) = fVar29;
        pvVar14 = pvVar12;
        if (uVar8 == _h) {
          *(float *)((long)pvVar9 + uVar19 * 4) = fVar32;
          pvVar14 = pvVar18;
        }
        *(float *)((long)pvVar14 + uVar19 * 4) = fVar32;
        pfVar23 = (float *)((long)pfVar23 + local_88);
        uVar28 = local_90;
      }
      if (uVar8 != _h) {
        pvVar15 = weight_hr->data;
        iVar24 = weight_hr->w;
        sVar10 = weight_hr->elemsize;
        for (uVar19 = 0; uVar19 != local_98; uVar19 = uVar19 + 1) {
          fVar29 = 0.0;
          for (uVar22 = 0; uVar28 != uVar22; uVar22 = uVar22 + 1) {
            fVar29 = *(float *)((long)pvVar15 + uVar22 * 4) *
                     *(float *)(CONCAT44(local_78.data._4_4_,local_78.data._0_4_) + uVar22 * 4) +
                     fVar29;
          }
          *(float *)((long)pvVar18 + uVar19 * 4) = fVar29;
          *(float *)((long)pvVar9 + uVar19 * 4) = fVar29;
          pvVar15 = (void *)((long)pvVar15 + (long)iVar24 * sVar10);
        }
      }
    }
    iVar24 = 0;
  }
  else {
    Mat::create(&local_78,_h,4,opt->workspace_allocator);
    iVar24 = -100;
    if ((CONCAT44(local_78.data._4_4_,local_78.data._0_4_) != 0) &&
       ((long)local_78.c * local_78.cstep != 0)) goto LAB_00339553;
  }
  piVar11 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if ((long *)CONCAT44(local_78.allocator._4_4_,local_78.allocator._0_4_) == (long *)0x0) {
        free((void *)CONCAT44(local_78.data._4_4_,local_78.data._0_4_));
      }
      else {
        (**(code **)(*(long *)CONCAT44(local_78.allocator._4_4_,local_78.allocator._0_4_) + 0x18))()
        ;
      }
    }
  }
LAB_0033a044:
  piVar11 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        free(local_128.data);
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar24;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, const Mat& weight_hr, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;
    int hidden_size = cell_state.w;

    // 4 x hidden_size
    Mat gates(4, hidden_size, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    Mat tmp_hidden_state;
    if (num_output != hidden_size)
    {
        tmp_hidden_state.create(hidden_size, 4u, opt.workspace_allocator);
        if (tmp_hidden_state.empty())
            return -100;
    }

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;

#if __AVX__
        int nn_hidden_size = hidden_size >> 1;
        int remain_hidden_size_start = nn_hidden_size << 1;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int qq = 0; qq < nn_hidden_size; qq++)
        {
            int q = qq * 2;

            const float* bias_c_IFOG = (const float*)bias_c + q * 4;

            // gate I F O G
            const float* weight_xc_IFOG = weight_xc.row(q / 2);
            const float* weight_hc_IFOG = weight_hc.row(q / 2);

            __m256 _IFOG = _mm256_loadu_ps(bias_c_IFOG);
            __m256 _sum1 = _mm256_setzero_ps();
            __m256 _sum2 = _mm256_setzero_ps();
            __m256 _sum3 = _mm256_setzero_ps();

            const float* x = bottom_blob.row(ti);

            int i = 0;
            for (; i + 3 < size; i += 4)
            {
                __m256 _xi0 = _mm256_broadcast_ss(x);
                __m256 _xi1 = _mm256_broadcast_ss(x + 1);
                __m256 _xi2 = _mm256_broadcast_ss(x + 2);
                __m256 _xi3 = _mm256_broadcast_ss(x + 3);
                __m256 _weight_xc_IFOG0 = _mm256_loadu_ps(weight_xc_IFOG);
                __m256 _weight_xc_IFOG1 = _mm256_loadu_ps(weight_xc_IFOG + 8);
                __m256 _weight_xc_IFOG2 = _mm256_loadu_ps(weight_xc_IFOG + 16);
                __m256 _weight_xc_IFOG3 = _mm256_loadu_ps(weight_xc_IFOG + 24);
                _IFOG = _mm256_comp_fmadd_ps(_weight_xc_IFOG0, _xi0, _IFOG);
                _sum1 = _mm256_comp_fmadd_ps(_weight_xc_IFOG1, _xi1, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_weight_xc_IFOG2, _xi2, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_weight_xc_IFOG3, _xi3, _sum3);

                x += 4;
                weight_xc_IFOG += 32;
            }
            for (; i < size; i++)
            {
                __m256 _xi = _mm256_broadcast_ss(x);
                __m256 _weight_xc_IFOG = _mm256_loadu_ps(weight_xc_IFOG);
                _IFOG = _mm256_comp_fmadd_ps(_weight_xc_IFOG, _xi, _IFOG);

                x += 1;
                weight_xc_IFOG += 8;
            }

            const float* hidden_ptr = hidden_state;

            i = 0;
            for (; i + 3 < num_output; i += 4)
            {
                __m256 _h_cont0 = _mm256_broadcast_ss(hidden_ptr);
                __m256 _h_cont1 = _mm256_broadcast_ss(hidden_ptr + 1);
                __m256 _h_cont2 = _mm256_broadcast_ss(hidden_ptr + 2);
                __m256 _h_cont3 = _mm256_broadcast_ss(hidden_ptr + 3);
                __m256 _weight_hc_IFOG0 = _mm256_loadu_ps(weight_hc_IFOG);
                __m256 _weight_hc_IFOG1 = _mm256_loadu_ps(weight_hc_IFOG + 8);
                __m256 _weight_hc_IFOG2 = _mm256_loadu_ps(weight_hc_IFOG + 16);
                __m256 _weight_hc_IFOG3 = _mm256_loadu_ps(weight_hc_IFOG + 24);
                _IFOG = _mm256_comp_fmadd_ps(_weight_hc_IFOG0, _h_cont0, _IFOG);
                _sum1 = _mm256_comp_fmadd_ps(_weight_hc_IFOG1, _h_cont1, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_weight_hc_IFOG2, _h_cont2, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_weight_hc_IFOG3, _h_cont3, _sum3);

                hidden_ptr += 4;
                weight_hc_IFOG += 32;
            }
            for (; i < num_output; i++)
            {
                __m256 _h_cont = _mm256_broadcast_ss(hidden_ptr);
                __m256 _weight_hc_IFOG = _mm256_loadu_ps(weight_hc_IFOG);
                _IFOG = _mm256_comp_fmadd_ps(_weight_hc_IFOG, _h_cont, _IFOG);

                hidden_ptr += 1;
                weight_hc_IFOG += 8;
            }

            float* gates_data = gates.row(q);

            _IFOG = _mm256_add_ps(_IFOG, _sum1);
            _sum2 = _mm256_add_ps(_sum2, _sum3);
            _IFOG = _mm256_add_ps(_IFOG, _sum2);

            _mm256_storeu_ps(gates_data, _IFOG);
        }
#else
        int nn_hidden_size = 0;
        int remain_hidden_size_start = 0;
#endif // __AVX__

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = remain_hidden_size_start; q < hidden_size; q++)
        {
            const float* bias_c_IFOG = (const float*)bias_c + q * 4;

            // gate I F O G
#if __AVX__
            const float* weight_xc_IFOG = weight_xc.row(q / 2 + q % 2);
            const float* weight_hc_IFOG = weight_hc.row(q / 2 + q % 2);
#else
            const float* weight_xc_IFOG = weight_xc.row(q);
            const float* weight_hc_IFOG = weight_hc.row(q);
#endif

#if __SSE2__
            __m128 _IFOG = _mm_loadu_ps(bias_c_IFOG);
            __m128 _sum1 = _mm_setzero_ps();
            __m128 _sum2 = _mm_setzero_ps();
            __m128 _sum3 = _mm_setzero_ps();
#else  // __SSE2__
            float I = bias_c_IFOG[0];
            float F = bias_c_IFOG[1];
            float O = bias_c_IFOG[2];
            float G = bias_c_IFOG[3];
#endif // __SSE2__

            const float* x = bottom_blob.row(ti);

            int i = 0;
#if __SSE2__
            for (; i + 3 < size; i += 4)
            {
                __m128 _xi0 = _mm_load1_ps(x);
                __m128 _xi1 = _mm_load1_ps(x + 1);
                __m128 _xi2 = _mm_load1_ps(x + 2);
                __m128 _xi3 = _mm_load1_ps(x + 3);
                __m128 _weight_xc_IFOG0 = _mm_loadu_ps(weight_xc_IFOG);
                __m128 _weight_xc_IFOG1 = _mm_loadu_ps(weight_xc_IFOG + 4);
                __m128 _weight_xc_IFOG2 = _mm_loadu_ps(weight_xc_IFOG + 8);
                __m128 _weight_xc_IFOG3 = _mm_loadu_ps(weight_xc_IFOG + 12);
                _IFOG = _mm_comp_fmadd_ps(_weight_xc_IFOG0, _xi0, _IFOG);
                _sum1 = _mm_comp_fmadd_ps(_weight_xc_IFOG1, _xi1, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_weight_xc_IFOG2, _xi2, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_weight_xc_IFOG3, _xi3, _sum3);

                x += 4;
                weight_xc_IFOG += 16;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
#if __SSE2__
                __m128 _xi = _mm_load1_ps(x);
                __m128 _weight_xc_IFOG = _mm_loadu_ps(weight_xc_IFOG);
                _IFOG = _mm_comp_fmadd_ps(_weight_xc_IFOG, _xi, _IFOG);
#else  // __SSE2__
                float xi = x[0];
                I += xi * weight_xc_IFOG[0];
                F += xi * weight_xc_IFOG[1];
                O += xi * weight_xc_IFOG[2];
                G += xi * weight_xc_IFOG[3];
#endif // __SSE2__

                x += 1;
                weight_xc_IFOG += 4;
            }

            const float* hidden_ptr = hidden_state;

            i = 0;
#if __SSE2__
            for (; i + 3 < num_output; i += 4)
            {
                __m128 _h_cont0 = _mm_load1_ps(hidden_ptr);
                __m128 _h_cont1 = _mm_load1_ps(hidden_ptr + 1);
                __m128 _h_cont2 = _mm_load1_ps(hidden_ptr + 2);
                __m128 _h_cont3 = _mm_load1_ps(hidden_ptr + 3);
                __m128 _weight_hc_IFOG0 = _mm_loadu_ps(weight_hc_IFOG);
                __m128 _weight_hc_IFOG1 = _mm_loadu_ps(weight_hc_IFOG + 4);
                __m128 _weight_hc_IFOG2 = _mm_loadu_ps(weight_hc_IFOG + 8);
                __m128 _weight_hc_IFOG3 = _mm_loadu_ps(weight_hc_IFOG + 12);
                _IFOG = _mm_comp_fmadd_ps(_weight_hc_IFOG0, _h_cont0, _IFOG);
                _sum1 = _mm_comp_fmadd_ps(_weight_hc_IFOG1, _h_cont1, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_weight_hc_IFOG2, _h_cont2, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_weight_hc_IFOG3, _h_cont3, _sum3);

                hidden_ptr += 4;
                weight_hc_IFOG += 16;
            }
#endif // __SSE2__
            for (; i < num_output; i++)
            {
#if __SSE2__
                __m128 _h_cont = _mm_load1_ps(hidden_ptr);
                __m128 _weight_hc_IFOG = _mm_loadu_ps(weight_hc_IFOG);
                _IFOG = _mm_comp_fmadd_ps(_weight_hc_IFOG, _h_cont, _IFOG);
#else  // __SSE2__
                float h_cont = hidden_ptr[0];
                I += h_cont * weight_hc_IFOG[0];
                F += h_cont * weight_hc_IFOG[1];
                O += h_cont * weight_hc_IFOG[2];
                G += h_cont * weight_hc_IFOG[3];
#endif // __SSE2__

                hidden_ptr += 1;
                weight_hc_IFOG += 4;
            }

            float* gates_data = gates.row(q);

#if __SSE2__
            _IFOG = _mm_add_ps(_IFOG, _sum1);
            _sum2 = _mm_add_ps(_sum2, _sum3);
            _IFOG = _mm_add_ps(_IFOG, _sum2);

            _mm_storeu_ps(gates_data, _IFOG);
#else  // __SSE2__
            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
#endif // __SSE2__
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);

        float* cell_ptr = cell_state;
        float* hidden_ptr = hidden_state;
        float* tmp_hidden_ptr = tmp_hidden_state;

#if __SSE2__
        nn_hidden_size = hidden_size >> 2;
        remain_hidden_size_start = nn_hidden_size << 2;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int qq = 0; qq < nn_hidden_size; qq++)
        {
            int q = qq * 4;

            const float* gates_data = gates.row(q);

            __m128 _IFOG_4x4_0 = _mm_loadu_ps(gates_data);
            __m128 _IFOG_4x4_1 = _mm_loadu_ps(gates_data + 4);
            __m128 _IFOG_4x4_2 = _mm_loadu_ps(gates_data + 8);
            __m128 _IFOG_4x4_3 = _mm_loadu_ps(gates_data + 12);

            _MM_TRANSPOSE4_PS(_IFOG_4x4_0, _IFOG_4x4_1, _IFOG_4x4_2, _IFOG_4x4_3);

            __m128 _I = sigmoid_sse(_IFOG_4x4_0);
            __m128 _F = sigmoid_sse(_IFOG_4x4_1);
            __m128 _O = sigmoid_sse(_IFOG_4x4_2);
            __m128 _G = tanh_sse(_IFOG_4x4_3);

            __m128 _cell2 = _mm_add_ps(_mm_mul_ps(_F, _mm_loadu_ps(cell_ptr + q)), _mm_mul_ps(_I, _G));
            __m128 _H = _mm_mul_ps(_O, tanh_sse(_cell2));

            _mm_storeu_ps(cell_ptr + q, _cell2);

            if (num_output == hidden_size)
            {
                _mm_storeu_ps(hidden_ptr + q, _H);
                _mm_storeu_ps(output_data + q, _H);
            }
            else
            {
                _mm_storeu_ps(tmp_hidden_ptr + q, _H);
            }
        }
#else  // __SSE2__
        remain_hidden_size_start = 0;
#endif // __SSE2__
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = remain_hidden_size_start; q < hidden_size; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + expf(-I));
            F = 1.f / (1.f + expf(-F));
            O = 1.f / (1.f + expf(-O));
            G = tanhf(G);

            float cell2 = F * cell_ptr[q] + I * G;
            float H = O * tanhf(cell2);

            cell_ptr[q] = cell2;
            if (num_output == hidden_size)
            {
                hidden_ptr[q] = H;
                output_data[q] = H;
            }
            else
            {
                tmp_hidden_ptr[q] = H;
            }
        }

        if (num_output != hidden_size)
        {
            // int nn_num_output = num_output >> 2;
            // int remain_num_output_start = nn_num_output << 2;
            // #pragma omp parallel for num_threads(opt.num_threads)
            // for (int qq = 0; qq < nn_num_output; qq++)
            // {
            //     int q = qq * 4;
            //
            // }
            int remain_num_output_start = 0;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = remain_num_output_start; q < num_output; q++)
            {
                const float* hr = weight_hr.row(q);
                const float* tmp_hidden_ptr = tmp_hidden_state;

                float H = 0;
                for (int i = 0; i < hidden_size; i++)
                {
                    H += tmp_hidden_ptr[i] * hr[i];
                }

                output_data[q] = H;
                hidden_ptr[q] = H;
            }
        }
    }

    return 0;
}